

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O2

void ihevc_inter_pred_luma_vert_w16out_ssse3
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  WORD16 *pWVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  WORD16 *pWVar10;
  long lVar11;
  int iVar12;
  ulong *puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar20 [16];
  undefined1 uVar49;
  undefined1 uVar50;
  undefined1 uVar51;
  undefined1 uVar52;
  undefined1 uVar53;
  undefined1 uVar54;
  undefined1 uVar55;
  undefined1 auVar21 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar56 [16];
  undefined1 auVar64 [16];
  undefined1 uVar86;
  undefined1 uVar87;
  undefined1 uVar88;
  undefined1 uVar89;
  undefined1 uVar90;
  undefined1 uVar91;
  undefined1 uVar92;
  undefined1 auVar71 [16];
  undefined1 auVar79 [16];
  undefined1 auVar93 [16];
  undefined1 auVar101 [16];
  undefined1 auVar109 [16];
  undefined1 auVar117 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar133 [16];
  undefined1 auVar140 [16];
  undefined1 auVar148 [16];
  undefined1 auVar155 [16];
  undefined1 auVar163 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar179 [16];
  undefined1 auVar187 [16];
  undefined1 auVar195 [16];
  undefined1 auVar202 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar219 [16];
  undefined1 auVar227 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar245 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  WORD16 *local_a0;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)pi1_coeff;
  auVar18 = pshuflw(in_XMM1,auVar17,0);
  auVar18._4_4_ = auVar18._0_4_;
  auVar18._8_4_ = auVar18._0_4_;
  auVar18._12_4_ = auVar18._0_4_;
  auVar19 = pshuflw(in_XMM2,auVar17,0x55);
  auVar19._4_4_ = auVar19._0_4_;
  auVar19._8_4_ = auVar19._0_4_;
  auVar19._12_4_ = auVar19._0_4_;
  auVar20 = pshuflw(in_XMM3,auVar17,0xaa);
  auVar17 = pshufb(auVar17,_DAT_0016b4f0);
  auVar20._4_4_ = auVar20._0_4_;
  auVar20._8_4_ = auVar20._0_4_;
  auVar20._12_4_ = auVar20._0_4_;
  lVar7 = (long)src_strd;
  lVar16 = (long)(src_strd * 2);
  lVar14 = (long)(src_strd * 3);
  lVar15 = (long)(src_strd * 4);
  iVar6 = dst_strd * 2;
  iVar8 = dst_strd * 4;
  iVar5 = dst_strd * 3;
  uVar9 = (ulong)wd;
  if ((uVar9 & 7) == 0) {
    local_a0 = pi2_dst + iVar8;
    for (lVar11 = 0; lVar11 < (long)uVar9; lVar11 = lVar11 + 8) {
      pWVar1 = pi2_dst + lVar11;
      uVar2 = *(ulong *)(pu1_src + lVar7 * -3 + lVar11);
      uVar3 = *(ulong *)(pu1_src + lVar7 * -2 + lVar11);
      uVar54 = (undefined1)(uVar3 >> 0x38);
      auVar41._8_6_ = 0;
      auVar41._0_8_ = uVar2;
      auVar41[0xe] = (char)(uVar2 >> 0x38);
      auVar41[0xf] = uVar54;
      auVar40._14_2_ = auVar41._14_2_;
      auVar40._8_5_ = 0;
      auVar40._0_8_ = uVar2;
      uVar53 = (undefined1)(uVar3 >> 0x30);
      auVar40[0xd] = uVar53;
      auVar39._13_3_ = auVar40._13_3_;
      auVar39._8_4_ = 0;
      auVar39._0_8_ = uVar2;
      auVar39[0xc] = (char)(uVar2 >> 0x30);
      auVar256._12_4_ = auVar39._12_4_;
      auVar256._8_3_ = 0;
      auVar256._0_8_ = uVar2;
      uVar52 = (undefined1)(uVar3 >> 0x28);
      auVar256[0xb] = uVar52;
      auVar255._11_5_ = auVar256._11_5_;
      auVar255._8_2_ = 0;
      auVar255._0_8_ = uVar2;
      auVar255[10] = (char)(uVar2 >> 0x28);
      auVar254._10_6_ = auVar255._10_6_;
      auVar254[8] = 0;
      auVar254._0_8_ = uVar2;
      uVar51 = (undefined1)(uVar3 >> 0x20);
      auVar254[9] = uVar51;
      auVar236._9_7_ = auVar254._9_7_;
      auVar236[8] = (char)(uVar2 >> 0x20);
      auVar236._0_8_ = uVar2;
      auVar38._8_8_ = auVar236._8_8_;
      uVar50 = (undefined1)(uVar3 >> 0x18);
      auVar38[7] = uVar50;
      auVar38[6] = (char)(uVar2 >> 0x18);
      uVar49 = (undefined1)(uVar3 >> 0x10);
      auVar38[5] = uVar49;
      auVar38[4] = (char)(uVar2 >> 0x10);
      uVar86 = (undefined1)(uVar3 >> 8);
      auVar38[3] = uVar86;
      auVar38[2] = (char)(uVar2 >> 8);
      auVar38[0] = (undefined1)uVar2;
      auVar219[0] = (undefined1)uVar3;
      auVar38[1] = auVar219[0];
      auVar253 = pmaddubsw(auVar38,auVar18);
      uVar2 = *(ulong *)(pu1_src + -lVar7 + lVar11);
      uVar4 = *(ulong *)(pu1_src + lVar11);
      uVar55 = (undefined1)(uVar2 >> 0x38);
      auVar226._8_6_ = 0;
      auVar226._0_8_ = uVar3;
      auVar226[0xe] = uVar54;
      auVar226[0xf] = uVar55;
      uVar54 = (undefined1)(uVar2 >> 0x30);
      auVar225._14_2_ = auVar226._14_2_;
      auVar225._8_5_ = 0;
      auVar225._0_8_ = uVar3;
      auVar225[0xd] = uVar54;
      auVar224._13_3_ = auVar225._13_3_;
      auVar224._8_4_ = 0;
      auVar224._0_8_ = uVar3;
      auVar224[0xc] = uVar53;
      uVar53 = (undefined1)(uVar2 >> 0x28);
      auVar223._12_4_ = auVar224._12_4_;
      auVar223._8_3_ = 0;
      auVar223._0_8_ = uVar3;
      auVar223[0xb] = uVar53;
      auVar222._11_5_ = auVar223._11_5_;
      auVar222._8_2_ = 0;
      auVar222._0_8_ = uVar3;
      auVar222[10] = uVar52;
      uVar52 = (undefined1)(uVar2 >> 0x20);
      auVar221._10_6_ = auVar222._10_6_;
      auVar221[8] = 0;
      auVar221._0_8_ = uVar3;
      auVar221[9] = uVar52;
      auVar220._9_7_ = auVar221._9_7_;
      auVar220[8] = uVar51;
      auVar220._0_8_ = uVar3;
      uVar51 = (undefined1)(uVar2 >> 0x18);
      auVar219._8_8_ = auVar220._8_8_;
      auVar219[7] = uVar51;
      auVar219[6] = uVar50;
      uVar50 = (undefined1)(uVar2 >> 0x10);
      auVar219[5] = uVar50;
      auVar219[4] = uVar49;
      uVar49 = (undefined1)(uVar2 >> 8);
      auVar219[3] = uVar49;
      auVar219[2] = uVar86;
      auVar219[1] = (char)uVar2;
      uVar91 = (undefined1)(uVar4 >> 0x38);
      auVar116._8_6_ = 0;
      auVar116._0_8_ = uVar2;
      auVar116[0xe] = uVar55;
      auVar116[0xf] = uVar91;
      auVar115._14_2_ = auVar116._14_2_;
      auVar115._8_5_ = 0;
      auVar115._0_8_ = uVar2;
      uVar90 = (undefined1)(uVar4 >> 0x30);
      auVar115[0xd] = uVar90;
      auVar114._13_3_ = auVar115._13_3_;
      auVar114._8_4_ = 0;
      auVar114._0_8_ = uVar2;
      auVar114[0xc] = uVar54;
      auVar113._12_4_ = auVar114._12_4_;
      auVar113._8_3_ = 0;
      auVar113._0_8_ = uVar2;
      uVar89 = (undefined1)(uVar4 >> 0x28);
      auVar113[0xb] = uVar89;
      auVar112._11_5_ = auVar113._11_5_;
      auVar112._8_2_ = 0;
      auVar112._0_8_ = uVar2;
      auVar112[10] = uVar53;
      auVar111._10_6_ = auVar112._10_6_;
      auVar111[8] = 0;
      auVar111._0_8_ = uVar2;
      uVar88 = (undefined1)(uVar4 >> 0x20);
      auVar111[9] = uVar88;
      auVar110._9_7_ = auVar111._9_7_;
      auVar110[8] = uVar52;
      auVar110._0_8_ = uVar2;
      auVar109._8_8_ = auVar110._8_8_;
      uVar87 = (undefined1)(uVar4 >> 0x18);
      auVar109[7] = uVar87;
      auVar109[6] = uVar51;
      uVar86 = (undefined1)(uVar4 >> 0x10);
      auVar109[5] = uVar86;
      auVar109[4] = uVar50;
      uVar55 = (undefined1)(uVar4 >> 8);
      auVar109[3] = uVar55;
      auVar109[2] = uVar49;
      auVar179[0] = (undefined1)uVar4;
      auVar109[1] = auVar179[0];
      auVar109[0] = (char)uVar2;
      auVar171 = pmaddubsw(auVar109,auVar19);
      uVar2 = *(ulong *)(pu1_src + lVar7 + lVar11);
      uVar3 = *(ulong *)(pu1_src + lVar16 + lVar11);
      uVar54 = (undefined1)(uVar2 >> 0x38);
      auVar186._8_6_ = 0;
      auVar186._0_8_ = uVar4;
      auVar186[0xe] = uVar91;
      auVar186[0xf] = uVar54;
      uVar53 = (undefined1)(uVar2 >> 0x30);
      auVar185._14_2_ = auVar186._14_2_;
      auVar185._8_5_ = 0;
      auVar185._0_8_ = uVar4;
      auVar185[0xd] = uVar53;
      auVar184._13_3_ = auVar185._13_3_;
      auVar184._8_4_ = 0;
      auVar184._0_8_ = uVar4;
      auVar184[0xc] = uVar90;
      uVar52 = (undefined1)(uVar2 >> 0x28);
      auVar183._12_4_ = auVar184._12_4_;
      auVar183._8_3_ = 0;
      auVar183._0_8_ = uVar4;
      auVar183[0xb] = uVar52;
      auVar182._11_5_ = auVar183._11_5_;
      auVar182._8_2_ = 0;
      auVar182._0_8_ = uVar4;
      auVar182[10] = uVar89;
      uVar51 = (undefined1)(uVar2 >> 0x20);
      auVar181._10_6_ = auVar182._10_6_;
      auVar181[8] = 0;
      auVar181._0_8_ = uVar4;
      auVar181[9] = uVar51;
      auVar180._9_7_ = auVar181._9_7_;
      auVar180[8] = uVar88;
      auVar180._0_8_ = uVar4;
      uVar50 = (undefined1)(uVar2 >> 0x18);
      auVar179._8_8_ = auVar180._8_8_;
      auVar179[7] = uVar50;
      auVar179[6] = uVar87;
      uVar49 = (undefined1)(uVar2 >> 0x10);
      auVar179[5] = uVar49;
      auVar179[4] = uVar86;
      uVar86 = (undefined1)(uVar2 >> 8);
      auVar179[3] = uVar86;
      auVar179[2] = uVar55;
      auVar210[0] = (undefined1)uVar2;
      auVar179[1] = auVar210[0];
      uVar55 = (undefined1)(uVar3 >> 0x38);
      auVar154._8_6_ = 0;
      auVar154._0_8_ = uVar2;
      auVar154[0xe] = uVar54;
      auVar154[0xf] = uVar55;
      uVar54 = (undefined1)(uVar3 >> 0x30);
      auVar153._14_2_ = auVar154._14_2_;
      auVar153._8_5_ = 0;
      auVar153._0_8_ = uVar2;
      auVar153[0xd] = uVar54;
      auVar152._13_3_ = auVar153._13_3_;
      auVar152._8_4_ = 0;
      auVar152._0_8_ = uVar2;
      auVar152[0xc] = uVar53;
      uVar53 = (undefined1)(uVar3 >> 0x28);
      auVar151._12_4_ = auVar152._12_4_;
      auVar151._8_3_ = 0;
      auVar151._0_8_ = uVar2;
      auVar151[0xb] = uVar53;
      auVar150._11_5_ = auVar151._11_5_;
      auVar150._8_2_ = 0;
      auVar150._0_8_ = uVar2;
      auVar150[10] = uVar52;
      uVar52 = (undefined1)(uVar3 >> 0x20);
      auVar149._10_6_ = auVar150._10_6_;
      auVar149[8] = 0;
      auVar149._0_8_ = uVar2;
      auVar149[9] = uVar52;
      auVar148._9_7_ = auVar149._9_7_;
      auVar148[8] = uVar51;
      auVar148._0_8_ = uVar2;
      uVar51 = (undefined1)(uVar3 >> 0x18);
      auVar210._8_8_ = auVar148._8_8_;
      auVar210[7] = uVar51;
      auVar210[6] = uVar50;
      uVar50 = (undefined1)(uVar3 >> 0x10);
      auVar210[5] = uVar50;
      auVar210[4] = uVar49;
      uVar49 = (undefined1)(uVar3 >> 8);
      auVar210[3] = uVar49;
      auVar210[2] = uVar86;
      auVar29[0] = (undefined1)uVar3;
      auVar210[1] = auVar29[0];
      auVar236 = pmaddubsw(auVar210,auVar20);
      uVar2 = *(ulong *)(pu1_src + lVar14 + lVar11);
      uVar4 = *(ulong *)(pu1_src + lVar15 + lVar11);
      uVar92 = (undefined1)(uVar2 >> 0x38);
      auVar48._8_6_ = 0;
      auVar48._0_8_ = uVar3;
      auVar48[0xe] = uVar55;
      auVar48[0xf] = uVar92;
      auVar47._14_2_ = auVar48._14_2_;
      auVar47._8_5_ = 0;
      auVar47._0_8_ = uVar3;
      uVar91 = (undefined1)(uVar2 >> 0x30);
      auVar47[0xd] = uVar91;
      auVar46._13_3_ = auVar47._13_3_;
      auVar46._8_4_ = 0;
      auVar46._0_8_ = uVar3;
      auVar46[0xc] = uVar54;
      auVar45._12_4_ = auVar46._12_4_;
      auVar45._8_3_ = 0;
      auVar45._0_8_ = uVar3;
      uVar90 = (undefined1)(uVar2 >> 0x28);
      auVar45[0xb] = uVar90;
      auVar44._11_5_ = auVar45._11_5_;
      auVar44._8_2_ = 0;
      auVar44._0_8_ = uVar3;
      auVar44[10] = uVar53;
      auVar43._10_6_ = auVar44._10_6_;
      auVar43[8] = 0;
      auVar43._0_8_ = uVar3;
      uVar89 = (undefined1)(uVar2 >> 0x20);
      auVar43[9] = uVar89;
      auVar42._9_7_ = auVar43._9_7_;
      auVar42[8] = uVar52;
      auVar42._0_8_ = uVar3;
      auVar29._8_8_ = auVar42._8_8_;
      uVar88 = (undefined1)(uVar2 >> 0x18);
      auVar29[7] = uVar88;
      auVar29[6] = uVar51;
      uVar87 = (undefined1)(uVar2 >> 0x10);
      auVar29[5] = uVar87;
      auVar29[4] = uVar50;
      uVar86 = (undefined1)(uVar2 >> 8);
      auVar29[3] = uVar86;
      auVar29[2] = uVar49;
      auVar235[0] = (undefined1)uVar2;
      auVar29[1] = auVar235[0];
      uVar55 = (undefined1)(uVar4 >> 0x38);
      auVar85._8_6_ = 0;
      auVar85._0_8_ = uVar2;
      auVar85[0xe] = uVar92;
      auVar85[0xf] = uVar55;
      uVar54 = (undefined1)(uVar4 >> 0x30);
      auVar84._14_2_ = auVar85._14_2_;
      auVar84._8_5_ = 0;
      auVar84._0_8_ = uVar2;
      auVar84[0xd] = uVar54;
      auVar83._13_3_ = auVar84._13_3_;
      auVar83._8_4_ = 0;
      auVar83._0_8_ = uVar2;
      auVar83[0xc] = uVar91;
      uVar53 = (undefined1)(uVar4 >> 0x28);
      auVar82._12_4_ = auVar83._12_4_;
      auVar82._8_3_ = 0;
      auVar82._0_8_ = uVar2;
      auVar82[0xb] = uVar53;
      auVar81._11_5_ = auVar82._11_5_;
      auVar81._8_2_ = 0;
      auVar81._0_8_ = uVar2;
      auVar81[10] = uVar90;
      uVar52 = (undefined1)(uVar4 >> 0x20);
      auVar80._10_6_ = auVar81._10_6_;
      auVar80[8] = 0;
      auVar80._0_8_ = uVar2;
      auVar80[9] = uVar52;
      auVar79._9_7_ = auVar80._9_7_;
      auVar79[8] = uVar89;
      auVar79._0_8_ = uVar2;
      uVar51 = (undefined1)(uVar4 >> 0x18);
      auVar235._8_8_ = auVar79._8_8_;
      auVar235[7] = uVar51;
      auVar235[6] = uVar88;
      uVar50 = (undefined1)(uVar4 >> 0x10);
      auVar235[5] = uVar50;
      auVar235[4] = uVar87;
      uVar49 = (undefined1)(uVar4 >> 8);
      auVar235[3] = uVar49;
      auVar235[2] = uVar86;
      auVar124[0] = (undefined1)uVar4;
      auVar235[1] = auVar124[0];
      auVar254 = pmaddubsw(auVar235,auVar17);
      *pWVar1 = auVar254._0_2_ + auVar236._0_2_ + auVar171._0_2_ + auVar253._0_2_;
      pWVar1[1] = auVar254._2_2_ + auVar236._2_2_ + auVar171._2_2_ + auVar253._2_2_;
      pWVar1[2] = auVar254._4_2_ + auVar236._4_2_ + auVar171._4_2_ + auVar253._4_2_;
      pWVar1[3] = auVar254._6_2_ + auVar236._6_2_ + auVar171._6_2_ + auVar253._6_2_;
      pWVar1[4] = auVar254._8_2_ + auVar236._8_2_ + auVar171._8_2_ + auVar253._8_2_;
      pWVar1[5] = auVar254._10_2_ + auVar236._10_2_ + auVar171._10_2_ + auVar253._10_2_;
      pWVar1[6] = auVar254._12_2_ + auVar236._12_2_ + auVar171._12_2_ + auVar253._12_2_;
      pWVar1[7] = auVar254._14_2_ + auVar236._14_2_ + auVar171._14_2_ + auVar253._14_2_;
      auVar236 = pmaddubsw(auVar109,auVar18);
      auVar254 = pmaddubsw(auVar210,auVar19);
      auVar255 = pmaddubsw(auVar235,auVar20);
      uVar2 = *(ulong *)(pu1_src + src_strd * 5 + lVar11);
      uVar3 = *(ulong *)(pu1_src + src_strd * 6 + lVar11);
      uVar92 = (undefined1)(uVar2 >> 0x38);
      auVar70._8_6_ = 0;
      auVar70._0_8_ = uVar4;
      auVar70[0xe] = uVar55;
      auVar70[0xf] = uVar92;
      auVar69._14_2_ = auVar70._14_2_;
      auVar69._8_5_ = 0;
      auVar69._0_8_ = uVar4;
      uVar91 = (undefined1)(uVar2 >> 0x30);
      auVar69[0xd] = uVar91;
      auVar68._13_3_ = auVar69._13_3_;
      auVar68._8_4_ = 0;
      auVar68._0_8_ = uVar4;
      auVar68[0xc] = uVar54;
      auVar67._12_4_ = auVar68._12_4_;
      auVar67._8_3_ = 0;
      auVar67._0_8_ = uVar4;
      uVar90 = (undefined1)(uVar2 >> 0x28);
      auVar67[0xb] = uVar90;
      auVar66._11_5_ = auVar67._11_5_;
      auVar66._8_2_ = 0;
      auVar66._0_8_ = uVar4;
      auVar66[10] = uVar53;
      auVar65._10_6_ = auVar66._10_6_;
      auVar65[8] = 0;
      auVar65._0_8_ = uVar4;
      uVar89 = (undefined1)(uVar2 >> 0x20);
      auVar65[9] = uVar89;
      auVar64._9_7_ = auVar65._9_7_;
      auVar64[8] = uVar52;
      auVar64._0_8_ = uVar4;
      auVar124._8_8_ = auVar64._8_8_;
      uVar88 = (undefined1)(uVar2 >> 0x18);
      auVar124[7] = uVar88;
      auVar124[6] = uVar51;
      uVar87 = (undefined1)(uVar2 >> 0x10);
      auVar124[5] = uVar87;
      auVar124[4] = uVar50;
      uVar86 = (undefined1)(uVar2 >> 8);
      auVar124[3] = uVar86;
      auVar124[2] = uVar49;
      auVar171[0] = (undefined1)uVar2;
      auVar124[1] = auVar171[0];
      uVar55 = (undefined1)(uVar3 >> 0x38);
      auVar139._8_6_ = 0;
      auVar139._0_8_ = uVar2;
      auVar139[0xe] = uVar92;
      auVar139[0xf] = uVar55;
      uVar54 = (undefined1)(uVar3 >> 0x30);
      auVar138._14_2_ = auVar139._14_2_;
      auVar138._8_5_ = 0;
      auVar138._0_8_ = uVar2;
      auVar138[0xd] = uVar54;
      auVar137._13_3_ = auVar138._13_3_;
      auVar137._8_4_ = 0;
      auVar137._0_8_ = uVar2;
      auVar137[0xc] = uVar91;
      uVar53 = (undefined1)(uVar3 >> 0x28);
      auVar136._12_4_ = auVar137._12_4_;
      auVar136._8_3_ = 0;
      auVar136._0_8_ = uVar2;
      auVar136[0xb] = uVar53;
      auVar135._11_5_ = auVar136._11_5_;
      auVar135._8_2_ = 0;
      auVar135._0_8_ = uVar2;
      auVar135[10] = uVar90;
      uVar52 = (undefined1)(uVar3 >> 0x20);
      auVar134._10_6_ = auVar135._10_6_;
      auVar134[8] = 0;
      auVar134._0_8_ = uVar2;
      auVar134[9] = uVar52;
      auVar133._9_7_ = auVar134._9_7_;
      auVar133[8] = uVar89;
      auVar133._0_8_ = uVar2;
      uVar51 = (undefined1)(uVar3 >> 0x18);
      auVar171._8_8_ = auVar133._8_8_;
      auVar171[7] = uVar51;
      auVar171[6] = uVar88;
      uVar50 = (undefined1)(uVar3 >> 0x10);
      auVar171[5] = uVar50;
      auVar171[4] = uVar87;
      uVar49 = (undefined1)(uVar3 >> 8);
      auVar171[3] = uVar49;
      auVar171[2] = uVar86;
      auVar253[0] = (undefined1)uVar3;
      auVar171[1] = auVar253[0];
      auVar256 = pmaddubsw(auVar171,auVar17);
      pWVar10 = pWVar1 + iVar6;
      *pWVar10 = auVar256._0_2_ + auVar255._0_2_ + auVar254._0_2_ + auVar236._0_2_;
      pWVar10[1] = auVar256._2_2_ + auVar255._2_2_ + auVar254._2_2_ + auVar236._2_2_;
      pWVar10[2] = auVar256._4_2_ + auVar255._4_2_ + auVar254._4_2_ + auVar236._4_2_;
      pWVar10[3] = auVar256._6_2_ + auVar255._6_2_ + auVar254._6_2_ + auVar236._6_2_;
      pWVar10[4] = auVar256._8_2_ + auVar255._8_2_ + auVar254._8_2_ + auVar236._8_2_;
      pWVar10[5] = auVar256._10_2_ + auVar255._10_2_ + auVar254._10_2_ + auVar236._10_2_;
      pWVar10[6] = auVar256._12_2_ + auVar255._12_2_ + auVar254._12_2_ + auVar236._12_2_;
      pWVar10[7] = auVar256._14_2_ + auVar255._14_2_ + auVar254._14_2_ + auVar236._14_2_;
      auVar236 = pmaddubsw(auVar219,auVar18);
      auVar255 = pmaddubsw(auVar179,auVar19);
      auVar254 = pmaddubsw(auVar29,auVar20);
      auVar256 = pmaddubsw(auVar124,auVar17);
      pWVar10 = pWVar1 + dst_strd;
      *pWVar10 = auVar256._0_2_ + auVar254._0_2_ + auVar255._0_2_ + auVar236._0_2_;
      pWVar10[1] = auVar256._2_2_ + auVar254._2_2_ + auVar255._2_2_ + auVar236._2_2_;
      pWVar10[2] = auVar256._4_2_ + auVar254._4_2_ + auVar255._4_2_ + auVar236._4_2_;
      pWVar10[3] = auVar256._6_2_ + auVar254._6_2_ + auVar255._6_2_ + auVar236._6_2_;
      pWVar10[4] = auVar256._8_2_ + auVar254._8_2_ + auVar255._8_2_ + auVar236._8_2_;
      pWVar10[5] = auVar256._10_2_ + auVar254._10_2_ + auVar255._10_2_ + auVar236._10_2_;
      pWVar10[6] = auVar256._12_2_ + auVar254._12_2_ + auVar255._12_2_ + auVar236._12_2_;
      pWVar10[7] = auVar256._14_2_ + auVar254._14_2_ + auVar255._14_2_ + auVar236._14_2_;
      auVar236 = pmaddubsw(auVar179,auVar18);
      auVar254 = pmaddubsw(auVar29,auVar19);
      auVar255 = pmaddubsw(auVar124,auVar20);
      uVar2 = *(ulong *)(pu1_src + src_strd * 7 + lVar11);
      auVar123._8_6_ = 0;
      auVar123._0_8_ = uVar3;
      auVar123[0xe] = uVar55;
      auVar123[0xf] = (char)(uVar2 >> 0x38);
      auVar122._14_2_ = auVar123._14_2_;
      auVar122._8_5_ = 0;
      auVar122._0_8_ = uVar3;
      auVar122[0xd] = (char)(uVar2 >> 0x30);
      auVar121._13_3_ = auVar122._13_3_;
      auVar121._8_4_ = 0;
      auVar121._0_8_ = uVar3;
      auVar121[0xc] = uVar54;
      auVar120._12_4_ = auVar121._12_4_;
      auVar120._8_3_ = 0;
      auVar120._0_8_ = uVar3;
      auVar120[0xb] = (char)(uVar2 >> 0x28);
      auVar119._11_5_ = auVar120._11_5_;
      auVar119._8_2_ = 0;
      auVar119._0_8_ = uVar3;
      auVar119[10] = uVar53;
      auVar118._10_6_ = auVar119._10_6_;
      auVar118[8] = 0;
      auVar118._0_8_ = uVar3;
      auVar118[9] = (char)(uVar2 >> 0x20);
      auVar117._9_7_ = auVar118._9_7_;
      auVar117[8] = uVar52;
      auVar117._0_8_ = uVar3;
      auVar253._8_8_ = auVar117._8_8_;
      auVar253[7] = (char)(uVar2 >> 0x18);
      auVar253[6] = uVar51;
      auVar253[5] = (char)(uVar2 >> 0x10);
      auVar253[4] = uVar50;
      auVar253[3] = (char)(uVar2 >> 8);
      auVar253[2] = uVar49;
      auVar253[1] = (char)uVar2;
      auVar256 = pmaddubsw(auVar253,auVar17);
      pWVar1 = pWVar1 + iVar5;
      *pWVar1 = auVar256._0_2_ + auVar255._0_2_ + auVar254._0_2_ + auVar236._0_2_;
      pWVar1[1] = auVar256._2_2_ + auVar255._2_2_ + auVar254._2_2_ + auVar236._2_2_;
      pWVar1[2] = auVar256._4_2_ + auVar255._4_2_ + auVar254._4_2_ + auVar236._4_2_;
      pWVar1[3] = auVar256._6_2_ + auVar255._6_2_ + auVar254._6_2_ + auVar236._6_2_;
      pWVar1[4] = auVar256._8_2_ + auVar255._8_2_ + auVar254._8_2_ + auVar236._8_2_;
      pWVar1[5] = auVar256._10_2_ + auVar255._10_2_ + auVar254._10_2_ + auVar236._10_2_;
      pWVar1[6] = auVar256._12_2_ + auVar255._12_2_ + auVar254._12_2_ + auVar236._12_2_;
      pWVar1[7] = auVar256._14_2_ + auVar255._14_2_ + auVar254._14_2_ + auVar236._14_2_;
      puVar13 = (ulong *)(pu1_src + src_strd * 8 + lVar11);
      pWVar10 = local_a0;
      for (iVar12 = 4; auVar236 = auVar171, iVar12 < ht; iVar12 = iVar12 + 4) {
        auVar210 = pmaddubsw(auVar210,auVar18);
        auVar255 = pmaddubsw(auVar235,auVar19);
        auVar171 = pmaddubsw(auVar236,auVar20);
        uVar3 = *puVar13;
        uVar54 = (undefined1)(uVar3 >> 0x38);
        auVar194._8_6_ = 0;
        auVar194._0_8_ = uVar2;
        auVar194[0xe] = (char)(uVar2 >> 0x38);
        auVar194[0xf] = uVar54;
        auVar193._14_2_ = auVar194._14_2_;
        auVar193._8_5_ = 0;
        auVar193._0_8_ = uVar2;
        uVar53 = (undefined1)(uVar3 >> 0x30);
        auVar193[0xd] = uVar53;
        auVar192._13_3_ = auVar193._13_3_;
        auVar192._8_4_ = 0;
        auVar192._0_8_ = uVar2;
        auVar192[0xc] = (char)(uVar2 >> 0x30);
        auVar191._12_4_ = auVar192._12_4_;
        auVar191._8_3_ = 0;
        auVar191._0_8_ = uVar2;
        uVar52 = (undefined1)(uVar3 >> 0x28);
        auVar191[0xb] = uVar52;
        auVar190._11_5_ = auVar191._11_5_;
        auVar190._8_2_ = 0;
        auVar190._0_8_ = uVar2;
        auVar190[10] = (char)(uVar2 >> 0x28);
        auVar189._10_6_ = auVar190._10_6_;
        auVar189[8] = 0;
        auVar189._0_8_ = uVar2;
        uVar51 = (undefined1)(uVar3 >> 0x20);
        auVar189[9] = uVar51;
        auVar188._9_7_ = auVar189._9_7_;
        auVar188[8] = (char)(uVar2 >> 0x20);
        auVar188._0_8_ = uVar2;
        auVar187._8_8_ = auVar188._8_8_;
        uVar50 = (undefined1)(uVar3 >> 0x18);
        auVar187[7] = uVar50;
        auVar187[6] = (char)(uVar2 >> 0x18);
        uVar49 = (undefined1)(uVar3 >> 0x10);
        auVar187[5] = uVar49;
        auVar187[4] = (char)(uVar2 >> 0x10);
        uVar86 = (undefined1)(uVar3 >> 8);
        auVar187[3] = uVar86;
        auVar187[2] = (char)(uVar2 >> 8);
        auVar187[0] = (undefined1)uVar2;
        auVar227[0] = (undefined1)uVar3;
        auVar187[1] = auVar227[0];
        auVar235 = pmaddubsw(auVar235,auVar18);
        auVar256 = pmaddubsw(auVar236,auVar19);
        auVar254 = pmaddubsw(auVar187,auVar17);
        *pWVar10 = auVar254._0_2_ + auVar171._0_2_ + auVar255._0_2_ + auVar210._0_2_;
        pWVar10[1] = auVar254._2_2_ + auVar171._2_2_ + auVar255._2_2_ + auVar210._2_2_;
        pWVar10[2] = auVar254._4_2_ + auVar171._4_2_ + auVar255._4_2_ + auVar210._4_2_;
        pWVar10[3] = auVar254._6_2_ + auVar171._6_2_ + auVar255._6_2_ + auVar210._6_2_;
        pWVar10[4] = auVar254._8_2_ + auVar171._8_2_ + auVar255._8_2_ + auVar210._8_2_;
        pWVar10[5] = auVar254._10_2_ + auVar171._10_2_ + auVar255._10_2_ + auVar210._10_2_;
        pWVar10[6] = auVar254._12_2_ + auVar171._12_2_ + auVar255._12_2_ + auVar210._12_2_;
        pWVar10[7] = auVar254._14_2_ + auVar171._14_2_ + auVar255._14_2_ + auVar210._14_2_;
        auVar254 = pmaddubsw(auVar187,auVar20);
        uVar2 = *(ulong *)((long)puVar13 + lVar7);
        uVar4 = *(ulong *)((long)puVar13 + lVar16);
        uVar55 = (undefined1)(uVar2 >> 0x38);
        auVar234._8_6_ = 0;
        auVar234._0_8_ = uVar3;
        auVar234[0xe] = uVar54;
        auVar234[0xf] = uVar55;
        uVar54 = (undefined1)(uVar2 >> 0x30);
        auVar233._14_2_ = auVar234._14_2_;
        auVar233._8_5_ = 0;
        auVar233._0_8_ = uVar3;
        auVar233[0xd] = uVar54;
        auVar232._13_3_ = auVar233._13_3_;
        auVar232._8_4_ = 0;
        auVar232._0_8_ = uVar3;
        auVar232[0xc] = uVar53;
        uVar53 = (undefined1)(uVar2 >> 0x28);
        auVar231._12_4_ = auVar232._12_4_;
        auVar231._8_3_ = 0;
        auVar231._0_8_ = uVar3;
        auVar231[0xb] = uVar53;
        auVar230._11_5_ = auVar231._11_5_;
        auVar230._8_2_ = 0;
        auVar230._0_8_ = uVar3;
        auVar230[10] = uVar52;
        uVar52 = (undefined1)(uVar2 >> 0x20);
        auVar229._10_6_ = auVar230._10_6_;
        auVar229[8] = 0;
        auVar229._0_8_ = uVar3;
        auVar229[9] = uVar52;
        auVar228._9_7_ = auVar229._9_7_;
        auVar228[8] = uVar51;
        auVar228._0_8_ = uVar3;
        uVar51 = (undefined1)(uVar2 >> 0x18);
        auVar227._8_8_ = auVar228._8_8_;
        auVar227[7] = uVar51;
        auVar227[6] = uVar50;
        uVar50 = (undefined1)(uVar2 >> 0x10);
        auVar227[5] = uVar50;
        auVar227[4] = uVar49;
        uVar49 = (undefined1)(uVar2 >> 8);
        auVar227[3] = uVar49;
        auVar227[2] = uVar86;
        auVar171[0] = (undefined1)uVar2;
        auVar227[1] = auVar171[0];
        uVar86 = (undefined1)(uVar4 >> 0x38);
        auVar201._8_6_ = 0;
        auVar201._0_8_ = uVar2;
        auVar201[0xe] = uVar55;
        auVar201[0xf] = uVar86;
        auVar200._14_2_ = auVar201._14_2_;
        auVar200._8_5_ = 0;
        auVar200._0_8_ = uVar2;
        uVar55 = (undefined1)(uVar4 >> 0x30);
        auVar200[0xd] = uVar55;
        auVar199._13_3_ = auVar200._13_3_;
        auVar199._8_4_ = 0;
        auVar199._0_8_ = uVar2;
        auVar199[0xc] = uVar54;
        auVar198._12_4_ = auVar199._12_4_;
        auVar198._8_3_ = 0;
        auVar198._0_8_ = uVar2;
        uVar54 = (undefined1)(uVar4 >> 0x28);
        auVar198[0xb] = uVar54;
        auVar197._11_5_ = auVar198._11_5_;
        auVar197._8_2_ = 0;
        auVar197._0_8_ = uVar2;
        auVar197[10] = uVar53;
        auVar196._10_6_ = auVar197._10_6_;
        auVar196[8] = 0;
        auVar196._0_8_ = uVar2;
        uVar53 = (undefined1)(uVar4 >> 0x20);
        auVar196[9] = uVar53;
        auVar195._9_7_ = auVar196._9_7_;
        auVar195[8] = uVar52;
        auVar195._0_8_ = uVar2;
        auVar171._8_8_ = auVar195._8_8_;
        uVar52 = (undefined1)(uVar4 >> 0x18);
        auVar171[7] = uVar52;
        auVar171[6] = uVar51;
        uVar51 = (undefined1)(uVar4 >> 0x10);
        auVar171[5] = uVar51;
        auVar171[4] = uVar50;
        uVar50 = (undefined1)(uVar4 >> 8);
        auVar171[3] = uVar50;
        auVar171[2] = uVar49;
        auVar245[0] = (undefined1)uVar4;
        auVar171[1] = auVar245[0];
        auVar210 = pmaddubsw(auVar171,auVar17);
        pWVar1 = pWVar10 + iVar6;
        *pWVar1 = auVar210._0_2_ + auVar254._0_2_ + auVar256._0_2_ + auVar235._0_2_;
        pWVar1[1] = auVar210._2_2_ + auVar254._2_2_ + auVar256._2_2_ + auVar235._2_2_;
        pWVar1[2] = auVar210._4_2_ + auVar254._4_2_ + auVar256._4_2_ + auVar235._4_2_;
        pWVar1[3] = auVar210._6_2_ + auVar254._6_2_ + auVar256._6_2_ + auVar235._6_2_;
        pWVar1[4] = auVar210._8_2_ + auVar254._8_2_ + auVar256._8_2_ + auVar235._8_2_;
        pWVar1[5] = auVar210._10_2_ + auVar254._10_2_ + auVar256._10_2_ + auVar235._10_2_;
        pWVar1[6] = auVar210._12_2_ + auVar254._12_2_ + auVar256._12_2_ + auVar235._12_2_;
        pWVar1[7] = auVar210._14_2_ + auVar254._14_2_ + auVar256._14_2_ + auVar235._14_2_;
        auVar29 = pmaddubsw(auVar29,auVar18);
        auVar210 = pmaddubsw(auVar124,auVar19);
        auVar235 = pmaddubsw(auVar253,auVar20);
        auVar124 = pmaddubsw(auVar124,auVar18);
        auVar255 = pmaddubsw(auVar253,auVar19);
        auVar254 = pmaddubsw(auVar227,auVar17);
        pWVar1 = pWVar10 + dst_strd;
        *pWVar1 = auVar254._0_2_ + auVar235._0_2_ + auVar210._0_2_ + auVar29._0_2_;
        pWVar1[1] = auVar254._2_2_ + auVar235._2_2_ + auVar210._2_2_ + auVar29._2_2_;
        pWVar1[2] = auVar254._4_2_ + auVar235._4_2_ + auVar210._4_2_ + auVar29._4_2_;
        pWVar1[3] = auVar254._6_2_ + auVar235._6_2_ + auVar210._6_2_ + auVar29._6_2_;
        pWVar1[4] = auVar254._8_2_ + auVar235._8_2_ + auVar210._8_2_ + auVar29._8_2_;
        pWVar1[5] = auVar254._10_2_ + auVar235._10_2_ + auVar210._10_2_ + auVar29._10_2_;
        pWVar1[6] = auVar254._12_2_ + auVar235._12_2_ + auVar210._12_2_ + auVar29._12_2_;
        pWVar1[7] = auVar254._14_2_ + auVar235._14_2_ + auVar210._14_2_ + auVar29._14_2_;
        uVar2 = *(ulong *)((long)puVar13 + lVar14);
        puVar13 = (ulong *)((long)puVar13 + lVar15);
        auVar235 = pmaddubsw(auVar227,auVar20);
        auVar252._8_6_ = 0;
        auVar252._0_8_ = uVar4;
        auVar252[0xe] = uVar86;
        auVar252[0xf] = (char)(uVar2 >> 0x38);
        auVar251._14_2_ = auVar252._14_2_;
        auVar251._8_5_ = 0;
        auVar251._0_8_ = uVar4;
        auVar251[0xd] = (char)(uVar2 >> 0x30);
        auVar250._13_3_ = auVar251._13_3_;
        auVar250._8_4_ = 0;
        auVar250._0_8_ = uVar4;
        auVar250[0xc] = uVar55;
        auVar249._12_4_ = auVar250._12_4_;
        auVar249._8_3_ = 0;
        auVar249._0_8_ = uVar4;
        auVar249[0xb] = (char)(uVar2 >> 0x28);
        auVar248._11_5_ = auVar249._11_5_;
        auVar248._8_2_ = 0;
        auVar248._0_8_ = uVar4;
        auVar248[10] = uVar54;
        auVar247._10_6_ = auVar248._10_6_;
        auVar247[8] = 0;
        auVar247._0_8_ = uVar4;
        auVar247[9] = (char)(uVar2 >> 0x20);
        auVar246._9_7_ = auVar247._9_7_;
        auVar246[8] = uVar53;
        auVar246._0_8_ = uVar4;
        auVar245._8_8_ = auVar246._8_8_;
        auVar245[7] = (char)(uVar2 >> 0x18);
        auVar245[6] = uVar52;
        auVar245[5] = (char)(uVar2 >> 0x10);
        auVar245[4] = uVar51;
        auVar245[3] = (char)(uVar2 >> 8);
        auVar245[2] = uVar50;
        auVar245[1] = (char)uVar2;
        auVar29 = pmaddubsw(auVar245,auVar17);
        pWVar1 = pWVar10 + iVar5;
        *pWVar1 = auVar29._0_2_ + auVar235._0_2_ + auVar255._0_2_ + auVar124._0_2_;
        pWVar1[1] = auVar29._2_2_ + auVar235._2_2_ + auVar255._2_2_ + auVar124._2_2_;
        pWVar1[2] = auVar29._4_2_ + auVar235._4_2_ + auVar255._4_2_ + auVar124._4_2_;
        pWVar1[3] = auVar29._6_2_ + auVar235._6_2_ + auVar255._6_2_ + auVar124._6_2_;
        pWVar1[4] = auVar29._8_2_ + auVar235._8_2_ + auVar255._8_2_ + auVar124._8_2_;
        pWVar1[5] = auVar29._10_2_ + auVar235._10_2_ + auVar255._10_2_ + auVar124._10_2_;
        pWVar1[6] = auVar29._12_2_ + auVar235._12_2_ + auVar255._12_2_ + auVar124._12_2_;
        pWVar1[7] = auVar29._14_2_ + auVar235._14_2_ + auVar255._14_2_ + auVar124._14_2_;
        pWVar10 = pWVar10 + iVar8;
        auVar29 = auVar253;
        auVar124 = auVar227;
        auVar235 = auVar187;
        auVar253 = auVar245;
        auVar210 = auVar236;
      }
      local_a0 = local_a0 + 8;
    }
  }
  else {
    local_a0 = pi2_dst + iVar8;
    for (lVar11 = 0; lVar11 < (long)uVar9; lVar11 = lVar11 + 4) {
      pWVar10 = pi2_dst + lVar11;
      uVar2 = *(ulong *)(pu1_src + lVar7 * -3 + lVar11);
      uVar3 = *(ulong *)(pu1_src + lVar7 * -2 + lVar11);
      uVar54 = (undefined1)(uVar3 >> 0x38);
      auVar28._8_6_ = 0;
      auVar28._0_8_ = uVar2;
      auVar28[0xe] = (char)(uVar2 >> 0x38);
      auVar28[0xf] = uVar54;
      auVar27._14_2_ = auVar28._14_2_;
      auVar27._8_5_ = 0;
      auVar27._0_8_ = uVar2;
      uVar53 = (undefined1)(uVar3 >> 0x30);
      auVar27[0xd] = uVar53;
      auVar26._13_3_ = auVar27._13_3_;
      auVar26._8_4_ = 0;
      auVar26._0_8_ = uVar2;
      auVar26[0xc] = (char)(uVar2 >> 0x30);
      auVar25._12_4_ = auVar26._12_4_;
      auVar25._8_3_ = 0;
      auVar25._0_8_ = uVar2;
      uVar52 = (undefined1)(uVar3 >> 0x28);
      auVar25[0xb] = uVar52;
      auVar24._11_5_ = auVar25._11_5_;
      auVar24._8_2_ = 0;
      auVar24._0_8_ = uVar2;
      auVar24[10] = (char)(uVar2 >> 0x28);
      auVar23._10_6_ = auVar24._10_6_;
      auVar23[8] = 0;
      auVar23._0_8_ = uVar2;
      uVar51 = (undefined1)(uVar3 >> 0x20);
      auVar23[9] = uVar51;
      auVar22._9_7_ = auVar23._9_7_;
      auVar22[8] = (char)(uVar2 >> 0x20);
      auVar22._0_8_ = uVar2;
      auVar21._8_8_ = auVar22._8_8_;
      uVar50 = (undefined1)(uVar3 >> 0x18);
      auVar21[7] = uVar50;
      auVar21[6] = (char)(uVar2 >> 0x18);
      uVar49 = (undefined1)(uVar3 >> 0x10);
      auVar21[5] = uVar49;
      auVar21[4] = (char)(uVar2 >> 0x10);
      uVar86 = (undefined1)(uVar3 >> 8);
      auVar21[3] = uVar86;
      auVar21[2] = (char)(uVar2 >> 8);
      auVar21[0] = (undefined1)uVar2;
      auVar202[0] = (undefined1)uVar3;
      auVar21[1] = auVar202[0];
      auVar29 = pmaddubsw(auVar21,auVar18);
      uVar2 = *(ulong *)(pu1_src + -lVar7 + lVar11);
      uVar4 = *(ulong *)(pu1_src + lVar11);
      uVar55 = (undefined1)(uVar2 >> 0x38);
      auVar209._8_6_ = 0;
      auVar209._0_8_ = uVar3;
      auVar209[0xe] = uVar54;
      auVar209[0xf] = uVar55;
      uVar54 = (undefined1)(uVar2 >> 0x30);
      auVar208._14_2_ = auVar209._14_2_;
      auVar208._8_5_ = 0;
      auVar208._0_8_ = uVar3;
      auVar208[0xd] = uVar54;
      auVar207._13_3_ = auVar208._13_3_;
      auVar207._8_4_ = 0;
      auVar207._0_8_ = uVar3;
      auVar207[0xc] = uVar53;
      uVar53 = (undefined1)(uVar2 >> 0x28);
      auVar206._12_4_ = auVar207._12_4_;
      auVar206._8_3_ = 0;
      auVar206._0_8_ = uVar3;
      auVar206[0xb] = uVar53;
      auVar205._11_5_ = auVar206._11_5_;
      auVar205._8_2_ = 0;
      auVar205._0_8_ = uVar3;
      auVar205[10] = uVar52;
      uVar52 = (undefined1)(uVar2 >> 0x20);
      auVar204._10_6_ = auVar205._10_6_;
      auVar204[8] = 0;
      auVar204._0_8_ = uVar3;
      auVar204[9] = uVar52;
      auVar203._9_7_ = auVar204._9_7_;
      auVar203[8] = uVar51;
      auVar203._0_8_ = uVar3;
      uVar51 = (undefined1)(uVar2 >> 0x18);
      auVar202._8_8_ = auVar203._8_8_;
      auVar202[7] = uVar51;
      auVar202[6] = uVar50;
      uVar50 = (undefined1)(uVar2 >> 0x10);
      auVar202[5] = uVar50;
      auVar202[4] = uVar49;
      uVar49 = (undefined1)(uVar2 >> 8);
      auVar202[3] = uVar49;
      auVar202[2] = uVar86;
      auVar202[1] = (char)uVar2;
      uVar91 = (undefined1)(uVar4 >> 0x38);
      auVar100._8_6_ = 0;
      auVar100._0_8_ = uVar2;
      auVar100[0xe] = uVar55;
      auVar100[0xf] = uVar91;
      auVar99._14_2_ = auVar100._14_2_;
      auVar99._8_5_ = 0;
      auVar99._0_8_ = uVar2;
      uVar90 = (undefined1)(uVar4 >> 0x30);
      auVar99[0xd] = uVar90;
      auVar98._13_3_ = auVar99._13_3_;
      auVar98._8_4_ = 0;
      auVar98._0_8_ = uVar2;
      auVar98[0xc] = uVar54;
      auVar97._12_4_ = auVar98._12_4_;
      auVar97._8_3_ = 0;
      auVar97._0_8_ = uVar2;
      uVar89 = (undefined1)(uVar4 >> 0x28);
      auVar97[0xb] = uVar89;
      auVar96._11_5_ = auVar97._11_5_;
      auVar96._8_2_ = 0;
      auVar96._0_8_ = uVar2;
      auVar96[10] = uVar53;
      auVar95._10_6_ = auVar96._10_6_;
      auVar95[8] = 0;
      auVar95._0_8_ = uVar2;
      uVar88 = (undefined1)(uVar4 >> 0x20);
      auVar95[9] = uVar88;
      auVar94._9_7_ = auVar95._9_7_;
      auVar94[8] = uVar52;
      auVar94._0_8_ = uVar2;
      auVar93._8_8_ = auVar94._8_8_;
      uVar87 = (undefined1)(uVar4 >> 0x18);
      auVar93[7] = uVar87;
      auVar93[6] = uVar51;
      uVar86 = (undefined1)(uVar4 >> 0x10);
      auVar93[5] = uVar86;
      auVar93[4] = uVar50;
      uVar55 = (undefined1)(uVar4 >> 8);
      auVar93[3] = uVar55;
      auVar93[2] = uVar49;
      auVar155[0] = (undefined1)uVar4;
      auVar93[1] = auVar155[0];
      auVar93[0] = (char)uVar2;
      auVar124 = pmaddubsw(auVar93,auVar19);
      uVar2 = *(ulong *)(pu1_src + lVar7 + lVar11);
      uVar3 = *(ulong *)(pu1_src + lVar16 + lVar11);
      uVar54 = (undefined1)(uVar2 >> 0x38);
      auVar162._8_6_ = 0;
      auVar162._0_8_ = uVar4;
      auVar162[0xe] = uVar91;
      auVar162[0xf] = uVar54;
      uVar53 = (undefined1)(uVar2 >> 0x30);
      auVar161._14_2_ = auVar162._14_2_;
      auVar161._8_5_ = 0;
      auVar161._0_8_ = uVar4;
      auVar161[0xd] = uVar53;
      auVar160._13_3_ = auVar161._13_3_;
      auVar160._8_4_ = 0;
      auVar160._0_8_ = uVar4;
      auVar160[0xc] = uVar90;
      uVar52 = (undefined1)(uVar2 >> 0x28);
      auVar159._12_4_ = auVar160._12_4_;
      auVar159._8_3_ = 0;
      auVar159._0_8_ = uVar4;
      auVar159[0xb] = uVar52;
      auVar158._11_5_ = auVar159._11_5_;
      auVar158._8_2_ = 0;
      auVar158._0_8_ = uVar4;
      auVar158[10] = uVar89;
      uVar51 = (undefined1)(uVar2 >> 0x20);
      auVar157._10_6_ = auVar158._10_6_;
      auVar157[8] = 0;
      auVar157._0_8_ = uVar4;
      auVar157[9] = uVar51;
      auVar156._9_7_ = auVar157._9_7_;
      auVar156[8] = uVar88;
      auVar156._0_8_ = uVar4;
      uVar50 = (undefined1)(uVar2 >> 0x18);
      auVar155._8_8_ = auVar156._8_8_;
      auVar155[7] = uVar50;
      auVar155[6] = uVar87;
      uVar49 = (undefined1)(uVar2 >> 0x10);
      auVar155[5] = uVar49;
      auVar155[4] = uVar86;
      uVar86 = (undefined1)(uVar2 >> 8);
      auVar155[3] = uVar86;
      auVar155[2] = uVar55;
      auVar140[0] = (undefined1)uVar2;
      auVar155[1] = auVar140[0];
      uVar55 = (undefined1)(uVar3 >> 0x38);
      auVar147._8_6_ = 0;
      auVar147._0_8_ = uVar2;
      auVar147[0xe] = uVar54;
      auVar147[0xf] = uVar55;
      uVar54 = (undefined1)(uVar3 >> 0x30);
      auVar146._14_2_ = auVar147._14_2_;
      auVar146._8_5_ = 0;
      auVar146._0_8_ = uVar2;
      auVar146[0xd] = uVar54;
      auVar145._13_3_ = auVar146._13_3_;
      auVar145._8_4_ = 0;
      auVar145._0_8_ = uVar2;
      auVar145[0xc] = uVar53;
      uVar53 = (undefined1)(uVar3 >> 0x28);
      auVar144._12_4_ = auVar145._12_4_;
      auVar144._8_3_ = 0;
      auVar144._0_8_ = uVar2;
      auVar144[0xb] = uVar53;
      auVar143._11_5_ = auVar144._11_5_;
      auVar143._8_2_ = 0;
      auVar143._0_8_ = uVar2;
      auVar143[10] = uVar52;
      uVar52 = (undefined1)(uVar3 >> 0x20);
      auVar142._10_6_ = auVar143._10_6_;
      auVar142[8] = 0;
      auVar142._0_8_ = uVar2;
      auVar142[9] = uVar52;
      auVar141._9_7_ = auVar142._9_7_;
      auVar141[8] = uVar51;
      auVar141._0_8_ = uVar2;
      uVar51 = (undefined1)(uVar3 >> 0x18);
      auVar140._8_8_ = auVar141._8_8_;
      auVar140[7] = uVar51;
      auVar140[6] = uVar50;
      uVar50 = (undefined1)(uVar3 >> 0x10);
      auVar140[5] = uVar50;
      auVar140[4] = uVar49;
      uVar49 = (undefined1)(uVar3 >> 8);
      auVar140[3] = uVar49;
      auVar140[2] = uVar86;
      auVar30[0] = (undefined1)uVar3;
      auVar140[1] = auVar30[0];
      auVar235 = pmaddubsw(auVar140,auVar20);
      uVar2 = *(ulong *)(pu1_src + lVar14 + lVar11);
      uVar4 = *(ulong *)(pu1_src + lVar15 + lVar11);
      uVar92 = (undefined1)(uVar2 >> 0x38);
      auVar37._8_6_ = 0;
      auVar37._0_8_ = uVar3;
      auVar37[0xe] = uVar55;
      auVar37[0xf] = uVar92;
      auVar36._14_2_ = auVar37._14_2_;
      auVar36._8_5_ = 0;
      auVar36._0_8_ = uVar3;
      uVar91 = (undefined1)(uVar2 >> 0x30);
      auVar36[0xd] = uVar91;
      auVar35._13_3_ = auVar36._13_3_;
      auVar35._8_4_ = 0;
      auVar35._0_8_ = uVar3;
      auVar35[0xc] = uVar54;
      auVar34._12_4_ = auVar35._12_4_;
      auVar34._8_3_ = 0;
      auVar34._0_8_ = uVar3;
      uVar90 = (undefined1)(uVar2 >> 0x28);
      auVar34[0xb] = uVar90;
      auVar33._11_5_ = auVar34._11_5_;
      auVar33._8_2_ = 0;
      auVar33._0_8_ = uVar3;
      auVar33[10] = uVar53;
      auVar32._10_6_ = auVar33._10_6_;
      auVar32[8] = 0;
      auVar32._0_8_ = uVar3;
      uVar89 = (undefined1)(uVar2 >> 0x20);
      auVar32[9] = uVar89;
      auVar31._9_7_ = auVar32._9_7_;
      auVar31[8] = uVar52;
      auVar31._0_8_ = uVar3;
      auVar30._8_8_ = auVar31._8_8_;
      uVar88 = (undefined1)(uVar2 >> 0x18);
      auVar30[7] = uVar88;
      auVar30[6] = uVar51;
      uVar87 = (undefined1)(uVar2 >> 0x10);
      auVar30[5] = uVar87;
      auVar30[4] = uVar50;
      uVar86 = (undefined1)(uVar2 >> 8);
      auVar30[3] = uVar86;
      auVar30[2] = uVar49;
      auVar71[0] = (undefined1)uVar2;
      auVar30[1] = auVar71[0];
      uVar55 = (undefined1)(uVar4 >> 0x38);
      auVar78._8_6_ = 0;
      auVar78._0_8_ = uVar2;
      auVar78[0xe] = uVar92;
      auVar78[0xf] = uVar55;
      uVar54 = (undefined1)(uVar4 >> 0x30);
      auVar77._14_2_ = auVar78._14_2_;
      auVar77._8_5_ = 0;
      auVar77._0_8_ = uVar2;
      auVar77[0xd] = uVar54;
      auVar76._13_3_ = auVar77._13_3_;
      auVar76._8_4_ = 0;
      auVar76._0_8_ = uVar2;
      auVar76[0xc] = uVar91;
      uVar53 = (undefined1)(uVar4 >> 0x28);
      auVar75._12_4_ = auVar76._12_4_;
      auVar75._8_3_ = 0;
      auVar75._0_8_ = uVar2;
      auVar75[0xb] = uVar53;
      auVar74._11_5_ = auVar75._11_5_;
      auVar74._8_2_ = 0;
      auVar74._0_8_ = uVar2;
      auVar74[10] = uVar90;
      uVar52 = (undefined1)(uVar4 >> 0x20);
      auVar73._10_6_ = auVar74._10_6_;
      auVar73[8] = 0;
      auVar73._0_8_ = uVar2;
      auVar73[9] = uVar52;
      auVar72._9_7_ = auVar73._9_7_;
      auVar72[8] = uVar89;
      auVar72._0_8_ = uVar2;
      uVar51 = (undefined1)(uVar4 >> 0x18);
      auVar71._8_8_ = auVar72._8_8_;
      auVar71[7] = uVar51;
      auVar71[6] = uVar88;
      uVar50 = (undefined1)(uVar4 >> 0x10);
      auVar71[5] = uVar50;
      auVar71[4] = uVar87;
      uVar49 = (undefined1)(uVar4 >> 8);
      auVar71[3] = uVar49;
      auVar71[2] = uVar86;
      auVar56[0] = (undefined1)uVar4;
      auVar71[1] = auVar56[0];
      auVar253 = pmaddubsw(auVar71,auVar17);
      *(ulong *)pWVar10 =
           CONCAT26(auVar253._6_2_ + auVar235._6_2_ + auVar124._6_2_ + auVar29._6_2_,
                    CONCAT24(auVar253._4_2_ + auVar235._4_2_ + auVar124._4_2_ + auVar29._4_2_,
                             CONCAT22(auVar253._2_2_ + auVar235._2_2_ +
                                      auVar124._2_2_ + auVar29._2_2_,
                                      auVar253._0_2_ + auVar235._0_2_ +
                                      auVar124._0_2_ + auVar29._0_2_)));
      auVar29 = pmaddubsw(auVar93,auVar18);
      auVar124 = pmaddubsw(auVar140,auVar19);
      auVar235 = pmaddubsw(auVar71,auVar20);
      uVar2 = *(ulong *)(pu1_src + src_strd * 5 + lVar11);
      uVar3 = *(ulong *)(pu1_src + src_strd * 6 + lVar11);
      uVar92 = (undefined1)(uVar2 >> 0x38);
      auVar63._8_6_ = 0;
      auVar63._0_8_ = uVar4;
      auVar63[0xe] = uVar55;
      auVar63[0xf] = uVar92;
      auVar62._14_2_ = auVar63._14_2_;
      auVar62._8_5_ = 0;
      auVar62._0_8_ = uVar4;
      uVar91 = (undefined1)(uVar2 >> 0x30);
      auVar62[0xd] = uVar91;
      auVar61._13_3_ = auVar62._13_3_;
      auVar61._8_4_ = 0;
      auVar61._0_8_ = uVar4;
      auVar61[0xc] = uVar54;
      auVar60._12_4_ = auVar61._12_4_;
      auVar60._8_3_ = 0;
      auVar60._0_8_ = uVar4;
      uVar90 = (undefined1)(uVar2 >> 0x28);
      auVar60[0xb] = uVar90;
      auVar59._11_5_ = auVar60._11_5_;
      auVar59._8_2_ = 0;
      auVar59._0_8_ = uVar4;
      auVar59[10] = uVar53;
      auVar58._10_6_ = auVar59._10_6_;
      auVar58[8] = 0;
      auVar58._0_8_ = uVar4;
      uVar89 = (undefined1)(uVar2 >> 0x20);
      auVar58[9] = uVar89;
      auVar57._9_7_ = auVar58._9_7_;
      auVar57[8] = uVar52;
      auVar57._0_8_ = uVar4;
      auVar56._8_8_ = auVar57._8_8_;
      uVar88 = (undefined1)(uVar2 >> 0x18);
      auVar56[7] = uVar88;
      auVar56[6] = uVar51;
      uVar87 = (undefined1)(uVar2 >> 0x10);
      auVar56[5] = uVar87;
      auVar56[4] = uVar50;
      uVar86 = (undefined1)(uVar2 >> 8);
      auVar56[3] = uVar86;
      auVar56[2] = uVar49;
      auVar125[0] = (undefined1)uVar2;
      auVar56[1] = auVar125[0];
      uVar55 = (undefined1)(uVar3 >> 0x38);
      auVar132._8_6_ = 0;
      auVar132._0_8_ = uVar2;
      auVar132[0xe] = uVar92;
      auVar132[0xf] = uVar55;
      uVar54 = (undefined1)(uVar3 >> 0x30);
      auVar131._14_2_ = auVar132._14_2_;
      auVar131._8_5_ = 0;
      auVar131._0_8_ = uVar2;
      auVar131[0xd] = uVar54;
      auVar130._13_3_ = auVar131._13_3_;
      auVar130._8_4_ = 0;
      auVar130._0_8_ = uVar2;
      auVar130[0xc] = uVar91;
      uVar53 = (undefined1)(uVar3 >> 0x28);
      auVar129._12_4_ = auVar130._12_4_;
      auVar129._8_3_ = 0;
      auVar129._0_8_ = uVar2;
      auVar129[0xb] = uVar53;
      auVar128._11_5_ = auVar129._11_5_;
      auVar128._8_2_ = 0;
      auVar128._0_8_ = uVar2;
      auVar128[10] = uVar90;
      uVar52 = (undefined1)(uVar3 >> 0x20);
      auVar127._10_6_ = auVar128._10_6_;
      auVar127[8] = 0;
      auVar127._0_8_ = uVar2;
      auVar127[9] = uVar52;
      auVar126._9_7_ = auVar127._9_7_;
      auVar126[8] = uVar89;
      auVar126._0_8_ = uVar2;
      uVar51 = (undefined1)(uVar3 >> 0x18);
      auVar125._8_8_ = auVar126._8_8_;
      auVar125[7] = uVar51;
      auVar125[6] = uVar88;
      uVar50 = (undefined1)(uVar3 >> 0x10);
      auVar125[5] = uVar50;
      auVar125[4] = uVar87;
      uVar49 = (undefined1)(uVar3 >> 8);
      auVar125[3] = uVar49;
      auVar125[2] = uVar86;
      auVar101[0] = (undefined1)uVar3;
      auVar125[1] = auVar101[0];
      auVar253 = pmaddubsw(auVar125,auVar17);
      *(ulong *)(pWVar10 + iVar6) =
           CONCAT26(auVar253._6_2_ + auVar235._6_2_ + auVar124._6_2_ + auVar29._6_2_,
                    CONCAT24(auVar253._4_2_ + auVar235._4_2_ + auVar124._4_2_ + auVar29._4_2_,
                             CONCAT22(auVar253._2_2_ + auVar235._2_2_ +
                                      auVar124._2_2_ + auVar29._2_2_,
                                      auVar253._0_2_ + auVar235._0_2_ +
                                      auVar124._0_2_ + auVar29._0_2_)));
      auVar29 = pmaddubsw(auVar202,auVar18);
      auVar235 = pmaddubsw(auVar155,auVar19);
      auVar124 = pmaddubsw(auVar30,auVar20);
      auVar253 = pmaddubsw(auVar56,auVar17);
      *(ulong *)(pWVar10 + dst_strd) =
           CONCAT26(auVar253._6_2_ + auVar124._6_2_ + auVar235._6_2_ + auVar29._6_2_,
                    CONCAT24(auVar253._4_2_ + auVar124._4_2_ + auVar235._4_2_ + auVar29._4_2_,
                             CONCAT22(auVar253._2_2_ + auVar124._2_2_ +
                                      auVar235._2_2_ + auVar29._2_2_,
                                      auVar253._0_2_ + auVar124._0_2_ +
                                      auVar235._0_2_ + auVar29._0_2_)));
      auVar29 = pmaddubsw(auVar155,auVar18);
      auVar124 = pmaddubsw(auVar30,auVar19);
      auVar235 = pmaddubsw(auVar56,auVar20);
      uVar2 = *(ulong *)(pu1_src + src_strd * 7 + lVar11);
      auVar108._8_6_ = 0;
      auVar108._0_8_ = uVar3;
      auVar108[0xe] = uVar55;
      auVar108[0xf] = (char)(uVar2 >> 0x38);
      auVar107._14_2_ = auVar108._14_2_;
      auVar107._8_5_ = 0;
      auVar107._0_8_ = uVar3;
      auVar107[0xd] = (char)(uVar2 >> 0x30);
      auVar106._13_3_ = auVar107._13_3_;
      auVar106._8_4_ = 0;
      auVar106._0_8_ = uVar3;
      auVar106[0xc] = uVar54;
      auVar105._12_4_ = auVar106._12_4_;
      auVar105._8_3_ = 0;
      auVar105._0_8_ = uVar3;
      auVar105[0xb] = (char)(uVar2 >> 0x28);
      auVar104._11_5_ = auVar105._11_5_;
      auVar104._8_2_ = 0;
      auVar104._0_8_ = uVar3;
      auVar104[10] = uVar53;
      auVar103._10_6_ = auVar104._10_6_;
      auVar103[8] = 0;
      auVar103._0_8_ = uVar3;
      auVar103[9] = (char)(uVar2 >> 0x20);
      auVar102._9_7_ = auVar103._9_7_;
      auVar102[8] = uVar52;
      auVar102._0_8_ = uVar3;
      auVar101._8_8_ = auVar102._8_8_;
      auVar101[7] = (char)(uVar2 >> 0x18);
      auVar101[6] = uVar51;
      auVar101[5] = (char)(uVar2 >> 0x10);
      auVar101[4] = uVar50;
      auVar101[3] = (char)(uVar2 >> 8);
      auVar101[2] = uVar49;
      auVar101[1] = (char)uVar2;
      auVar253 = pmaddubsw(auVar101,auVar17);
      *(ulong *)(pWVar10 + iVar5) =
           CONCAT26(auVar253._6_2_ + auVar235._6_2_ + auVar124._6_2_ + auVar29._6_2_,
                    CONCAT24(auVar253._4_2_ + auVar235._4_2_ + auVar124._4_2_ + auVar29._4_2_,
                             CONCAT22(auVar253._2_2_ + auVar235._2_2_ +
                                      auVar124._2_2_ + auVar29._2_2_,
                                      auVar253._0_2_ + auVar235._0_2_ +
                                      auVar124._0_2_ + auVar29._0_2_)));
      puVar13 = (ulong *)(pu1_src + src_strd * 8 + lVar11);
      pWVar10 = local_a0;
      for (iVar12 = 4; auVar29 = auVar125, iVar12 < ht; iVar12 = iVar12 + 4) {
        auVar253 = pmaddubsw(auVar140,auVar18);
        auVar210 = pmaddubsw(auVar71,auVar19);
        auVar235 = pmaddubsw(auVar29,auVar20);
        uVar3 = *puVar13;
        uVar54 = (undefined1)(uVar3 >> 0x38);
        auVar170._8_6_ = 0;
        auVar170._0_8_ = uVar2;
        auVar170[0xe] = (char)(uVar2 >> 0x38);
        auVar170[0xf] = uVar54;
        auVar169._14_2_ = auVar170._14_2_;
        auVar169._8_5_ = 0;
        auVar169._0_8_ = uVar2;
        uVar53 = (undefined1)(uVar3 >> 0x30);
        auVar169[0xd] = uVar53;
        auVar168._13_3_ = auVar169._13_3_;
        auVar168._8_4_ = 0;
        auVar168._0_8_ = uVar2;
        auVar168[0xc] = (char)(uVar2 >> 0x30);
        auVar167._12_4_ = auVar168._12_4_;
        auVar167._8_3_ = 0;
        auVar167._0_8_ = uVar2;
        uVar52 = (undefined1)(uVar3 >> 0x28);
        auVar167[0xb] = uVar52;
        auVar166._11_5_ = auVar167._11_5_;
        auVar166._8_2_ = 0;
        auVar166._0_8_ = uVar2;
        auVar166[10] = (char)(uVar2 >> 0x28);
        auVar165._10_6_ = auVar166._10_6_;
        auVar165[8] = 0;
        auVar165._0_8_ = uVar2;
        uVar51 = (undefined1)(uVar3 >> 0x20);
        auVar165[9] = uVar51;
        auVar164._9_7_ = auVar165._9_7_;
        auVar164[8] = (char)(uVar2 >> 0x20);
        auVar164._0_8_ = uVar2;
        auVar163._8_8_ = auVar164._8_8_;
        uVar50 = (undefined1)(uVar3 >> 0x18);
        auVar163[7] = uVar50;
        auVar163[6] = (char)(uVar2 >> 0x18);
        uVar49 = (undefined1)(uVar3 >> 0x10);
        auVar163[5] = uVar49;
        auVar163[4] = (char)(uVar2 >> 0x10);
        uVar86 = (undefined1)(uVar3 >> 8);
        auVar163[3] = uVar86;
        auVar163[2] = (char)(uVar2 >> 8);
        auVar163[0] = (undefined1)uVar2;
        auVar211[0] = (undefined1)uVar3;
        auVar163[1] = auVar211[0];
        auVar124 = pmaddubsw(auVar71,auVar18);
        auVar236 = pmaddubsw(auVar29,auVar19);
        auVar171 = pmaddubsw(auVar163,auVar17);
        *(ulong *)pWVar10 =
             CONCAT26(auVar171._6_2_ + auVar235._6_2_ + auVar210._6_2_ + auVar253._6_2_,
                      CONCAT24(auVar171._4_2_ + auVar235._4_2_ + auVar210._4_2_ + auVar253._4_2_,
                               CONCAT22(auVar171._2_2_ +
                                        auVar235._2_2_ + auVar210._2_2_ + auVar253._2_2_,
                                        auVar171._0_2_ +
                                        auVar235._0_2_ + auVar210._0_2_ + auVar253._0_2_)));
        auVar253 = pmaddubsw(auVar163,auVar20);
        uVar2 = *(ulong *)((long)puVar13 + lVar7);
        uVar4 = *(ulong *)((long)puVar13 + lVar16);
        uVar55 = (undefined1)(uVar2 >> 0x38);
        auVar218._8_6_ = 0;
        auVar218._0_8_ = uVar3;
        auVar218[0xe] = uVar54;
        auVar218[0xf] = uVar55;
        uVar54 = (undefined1)(uVar2 >> 0x30);
        auVar217._14_2_ = auVar218._14_2_;
        auVar217._8_5_ = 0;
        auVar217._0_8_ = uVar3;
        auVar217[0xd] = uVar54;
        auVar216._13_3_ = auVar217._13_3_;
        auVar216._8_4_ = 0;
        auVar216._0_8_ = uVar3;
        auVar216[0xc] = uVar53;
        uVar53 = (undefined1)(uVar2 >> 0x28);
        auVar215._12_4_ = auVar216._12_4_;
        auVar215._8_3_ = 0;
        auVar215._0_8_ = uVar3;
        auVar215[0xb] = uVar53;
        auVar214._11_5_ = auVar215._11_5_;
        auVar214._8_2_ = 0;
        auVar214._0_8_ = uVar3;
        auVar214[10] = uVar52;
        uVar52 = (undefined1)(uVar2 >> 0x20);
        auVar213._10_6_ = auVar214._10_6_;
        auVar213[8] = 0;
        auVar213._0_8_ = uVar3;
        auVar213[9] = uVar52;
        auVar212._9_7_ = auVar213._9_7_;
        auVar212[8] = uVar51;
        auVar212._0_8_ = uVar3;
        uVar51 = (undefined1)(uVar2 >> 0x18);
        auVar211._8_8_ = auVar212._8_8_;
        auVar211[7] = uVar51;
        auVar211[6] = uVar50;
        uVar50 = (undefined1)(uVar2 >> 0x10);
        auVar211[5] = uVar50;
        auVar211[4] = uVar49;
        uVar49 = (undefined1)(uVar2 >> 8);
        auVar211[3] = uVar49;
        auVar211[2] = uVar86;
        auVar125[0] = (undefined1)uVar2;
        auVar211[1] = auVar125[0];
        uVar86 = (undefined1)(uVar4 >> 0x38);
        auVar178._8_6_ = 0;
        auVar178._0_8_ = uVar2;
        auVar178[0xe] = uVar55;
        auVar178[0xf] = uVar86;
        auVar177._14_2_ = auVar178._14_2_;
        auVar177._8_5_ = 0;
        auVar177._0_8_ = uVar2;
        uVar55 = (undefined1)(uVar4 >> 0x30);
        auVar177[0xd] = uVar55;
        auVar176._13_3_ = auVar177._13_3_;
        auVar176._8_4_ = 0;
        auVar176._0_8_ = uVar2;
        auVar176[0xc] = uVar54;
        auVar175._12_4_ = auVar176._12_4_;
        auVar175._8_3_ = 0;
        auVar175._0_8_ = uVar2;
        uVar54 = (undefined1)(uVar4 >> 0x28);
        auVar175[0xb] = uVar54;
        auVar174._11_5_ = auVar175._11_5_;
        auVar174._8_2_ = 0;
        auVar174._0_8_ = uVar2;
        auVar174[10] = uVar53;
        auVar173._10_6_ = auVar174._10_6_;
        auVar173[8] = 0;
        auVar173._0_8_ = uVar2;
        uVar53 = (undefined1)(uVar4 >> 0x20);
        auVar173[9] = uVar53;
        auVar172._9_7_ = auVar173._9_7_;
        auVar172[8] = uVar52;
        auVar172._0_8_ = uVar2;
        auVar125._8_8_ = auVar172._8_8_;
        uVar52 = (undefined1)(uVar4 >> 0x18);
        auVar125[7] = uVar52;
        auVar125[6] = uVar51;
        uVar51 = (undefined1)(uVar4 >> 0x10);
        auVar125[5] = uVar51;
        auVar125[4] = uVar50;
        uVar50 = (undefined1)(uVar4 >> 8);
        auVar125[3] = uVar50;
        auVar125[2] = uVar49;
        auVar237[0] = (undefined1)uVar4;
        auVar125[1] = auVar237[0];
        auVar235 = pmaddubsw(auVar125,auVar17);
        *(ulong *)(pWVar10 + iVar6) =
             CONCAT26(auVar235._6_2_ + auVar253._6_2_ + auVar236._6_2_ + auVar124._6_2_,
                      CONCAT24(auVar235._4_2_ + auVar253._4_2_ + auVar236._4_2_ + auVar124._4_2_,
                               CONCAT22(auVar235._2_2_ +
                                        auVar253._2_2_ + auVar236._2_2_ + auVar124._2_2_,
                                        auVar235._0_2_ +
                                        auVar253._0_2_ + auVar236._0_2_ + auVar124._0_2_)));
        auVar124 = pmaddubsw(auVar30,auVar18);
        auVar171 = pmaddubsw(auVar56,auVar19);
        auVar253 = pmaddubsw(auVar101,auVar20);
        auVar235 = pmaddubsw(auVar56,auVar18);
        auVar236 = pmaddubsw(auVar101,auVar19);
        auVar210 = pmaddubsw(auVar211,auVar17);
        *(ulong *)(pWVar10 + dst_strd) =
             CONCAT26(auVar210._6_2_ + auVar253._6_2_ + auVar171._6_2_ + auVar124._6_2_,
                      CONCAT24(auVar210._4_2_ + auVar253._4_2_ + auVar171._4_2_ + auVar124._4_2_,
                               CONCAT22(auVar210._2_2_ +
                                        auVar253._2_2_ + auVar171._2_2_ + auVar124._2_2_,
                                        auVar210._0_2_ +
                                        auVar253._0_2_ + auVar171._0_2_ + auVar124._0_2_)));
        uVar2 = *(ulong *)((long)puVar13 + lVar14);
        puVar13 = (ulong *)((long)puVar13 + lVar15);
        auVar253 = pmaddubsw(auVar211,auVar20);
        auVar244._8_6_ = 0;
        auVar244._0_8_ = uVar4;
        auVar244[0xe] = uVar86;
        auVar244[0xf] = (char)(uVar2 >> 0x38);
        auVar243._14_2_ = auVar244._14_2_;
        auVar243._8_5_ = 0;
        auVar243._0_8_ = uVar4;
        auVar243[0xd] = (char)(uVar2 >> 0x30);
        auVar242._13_3_ = auVar243._13_3_;
        auVar242._8_4_ = 0;
        auVar242._0_8_ = uVar4;
        auVar242[0xc] = uVar55;
        auVar241._12_4_ = auVar242._12_4_;
        auVar241._8_3_ = 0;
        auVar241._0_8_ = uVar4;
        auVar241[0xb] = (char)(uVar2 >> 0x28);
        auVar240._11_5_ = auVar241._11_5_;
        auVar240._8_2_ = 0;
        auVar240._0_8_ = uVar4;
        auVar240[10] = uVar54;
        auVar239._10_6_ = auVar240._10_6_;
        auVar239[8] = 0;
        auVar239._0_8_ = uVar4;
        auVar239[9] = (char)(uVar2 >> 0x20);
        auVar238._9_7_ = auVar239._9_7_;
        auVar238[8] = uVar53;
        auVar238._0_8_ = uVar4;
        auVar237._8_8_ = auVar238._8_8_;
        auVar237[7] = (char)(uVar2 >> 0x18);
        auVar237[6] = uVar52;
        auVar237[5] = (char)(uVar2 >> 0x10);
        auVar237[4] = uVar51;
        auVar237[3] = (char)(uVar2 >> 8);
        auVar237[2] = uVar50;
        auVar237[1] = (char)uVar2;
        auVar124 = pmaddubsw(auVar237,auVar17);
        *(ulong *)(pWVar10 + iVar5) =
             CONCAT26(auVar124._6_2_ + auVar253._6_2_ + auVar236._6_2_ + auVar235._6_2_,
                      CONCAT24(auVar124._4_2_ + auVar253._4_2_ + auVar236._4_2_ + auVar235._4_2_,
                               CONCAT22(auVar124._2_2_ +
                                        auVar253._2_2_ + auVar236._2_2_ + auVar235._2_2_,
                                        auVar124._0_2_ +
                                        auVar253._0_2_ + auVar236._0_2_ + auVar235._0_2_)));
        pWVar10 = pWVar10 + iVar8;
        auVar30 = auVar101;
        auVar56 = auVar211;
        auVar71 = auVar163;
        auVar101 = auVar237;
        auVar140 = auVar29;
      }
      local_a0 = local_a0 + 4;
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_vert_w16out_ssse3(UWORD8 *pu1_src,
                                             WORD16 *pi2_dst,
                                             WORD32 src_strd,
                                             WORD32 dst_strd,
                                             WORD8 *pi1_coeff,
                                             WORD32 ht,
                                             WORD32 wd)
{
    WORD32 row, col;
    UWORD8 *pu1_src_copy;
    WORD16 *pi2_dst_copy;
    __m128i coeff0_1_8x16b, coeff2_3_8x16b, coeff4_5_8x16b, coeff6_7_8x16b;
    __m128i s0_8x16b, s1_8x16b, s2_8x16b, s3_8x16b, s4_8x16b, s5_8x16b, s6_8x16b;
    __m128i s2_0_16x8b, s2_1_16x8b, s2_2_16x8b, s2_3_16x8b, s2_4_16x8b, s2_5_16x8b, s2_6_16x8b, s2_7_16x8b, s2_8_16x8b, s2_9_16x8b, s2_10_16x8b;
    __m128i s3_0_16x8b, s3_1_16x8b, s3_2_16x8b, s3_3_16x8b, s3_4_16x8b;
    __m128i s4_0_16x8b, s4_1_16x8b, s4_2_16x8b, s4_3_16x8b, s4_4_16x8b;
    __m128i s10_8x16b, s11_8x16b, s12_8x16b, s13_8x16b, s14_8x16b, s15_8x16b, s16_8x16b;
    __m128i s20_8x16b, s21_8x16b, s22_8x16b, s23_8x16b, s24_8x16b, s25_8x16b, s26_8x16b;
    __m128i s30_8x16b, s31_8x16b, s32_8x16b, s33_8x16b, s34_8x16b, s35_8x16b, s36_8x16b;


    __m128i control_mask_1_8x16b, control_mask_2_8x16b, control_mask_3_8x16b, control_mask_4_8x16b;

/* load 8 8-bit coefficients and convert 8-bit into 16-bit  */
    s4_8x16b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    control_mask_1_8x16b = _mm_set1_epi32(0x01000100); /* Control Mask register */
    control_mask_2_8x16b = _mm_set1_epi32(0x03020302); /* Control Mask register */
    control_mask_3_8x16b = _mm_set1_epi32(0x05040504); /* Control Mask register */
    control_mask_4_8x16b = _mm_set1_epi32(0x07060706); /* Control Mask register */

    coeff0_1_8x16b = _mm_shuffle_epi8(s4_8x16b, control_mask_1_8x16b);  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi8(s4_8x16b, control_mask_2_8x16b);  /* pi1_coeff[4] */

    coeff4_5_8x16b = _mm_shuffle_epi8(s4_8x16b, control_mask_3_8x16b);  /* pi1_coeff[4] */
    coeff6_7_8x16b = _mm_shuffle_epi8(s4_8x16b, control_mask_4_8x16b);  /* pi1_coeff[4] */


/*  outer for loop starts from here */
    if((wd % 8) == 0)
    { /* wd = multiple of 8 case */

        pu1_src_copy = pu1_src;
        pi2_dst_copy = pi2_dst;

        for(col = 0; col < wd; col += 8)
        {

            pu1_src = pu1_src_copy + col;
            pi2_dst = pi2_dst_copy + col;

            PREFETCH((char const *)(pu1_src + (8 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (9 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (10 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (11 * src_strd)), _MM_HINT_T0)

            /*load 8 pixel values */
            s2_0_16x8b  = _mm_loadl_epi64((__m128i *)(pu1_src + (-3 * src_strd)));

            /*load 8 pixel values */
            s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (-2 * src_strd)));

            s3_0_16x8b = _mm_unpacklo_epi8(s2_0_16x8b, s2_1_16x8b);

            s0_8x16b = _mm_maddubs_epi16(s3_0_16x8b, coeff0_1_8x16b);

            /*load 8 pixel values */
            s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (-1 * src_strd)));

            /*load 8 pixel values */
            s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (0 * src_strd)));

            s3_1_16x8b = _mm_unpacklo_epi8(s2_2_16x8b, s2_3_16x8b);

            s1_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff2_3_8x16b);

            /*load 8 pixel values */
            s2_4_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (1 * src_strd)));

            /*load 8 pixel values */
            s2_5_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (2 * src_strd)));

            s3_2_16x8b = _mm_unpacklo_epi8(s2_4_16x8b, s2_5_16x8b);

            s2_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_6_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (3 * src_strd)));

            /*load 8 pixel values */
            s2_7_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (4 * src_strd)));

            s3_3_16x8b = _mm_unpacklo_epi8(s2_6_16x8b, s2_7_16x8b);

            s3_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff6_7_8x16b);

            s4_8x16b = _mm_add_epi16(s0_8x16b, s1_8x16b);
            s5_8x16b = _mm_add_epi16(s2_8x16b, s3_8x16b);
            s6_8x16b = _mm_add_epi16(s4_8x16b, s5_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 0*/
            _mm_store_si128((__m128i *)(pi2_dst), s6_8x16b);

            /* ROW 2*/
            s20_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff0_1_8x16b);
            s21_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff2_3_8x16b);
            s22_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_8_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (5 * src_strd)));

            /*load 8 pixel values */
            s2_9_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (6 * src_strd)));

            s3_4_16x8b = _mm_unpacklo_epi8(s2_8_16x8b, s2_9_16x8b);

            s23_8x16b = _mm_maddubs_epi16(s3_4_16x8b, coeff6_7_8x16b);

            s24_8x16b = _mm_add_epi16(s20_8x16b, s21_8x16b);
            s25_8x16b = _mm_add_epi16(s22_8x16b, s23_8x16b);
            s26_8x16b = _mm_add_epi16(s24_8x16b, s25_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 2*/
            _mm_store_si128((__m128i *)(pi2_dst + (2 * dst_strd)), s26_8x16b);


            /*ROW 1*/
            s4_0_16x8b = _mm_unpacklo_epi8(s2_1_16x8b, s2_2_16x8b);

            s10_8x16b = _mm_maddubs_epi16(s4_0_16x8b, coeff0_1_8x16b);

            s4_1_16x8b = _mm_unpacklo_epi8(s2_3_16x8b, s2_4_16x8b);

            s11_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff2_3_8x16b);

            s4_2_16x8b = _mm_unpacklo_epi8(s2_5_16x8b, s2_6_16x8b);

            s12_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff4_5_8x16b);

            s4_3_16x8b = _mm_unpacklo_epi8(s2_7_16x8b, s2_8_16x8b);

            s13_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff6_7_8x16b);

            s14_8x16b = _mm_add_epi16(s10_8x16b, s11_8x16b);
            s15_8x16b = _mm_add_epi16(s12_8x16b, s13_8x16b);
            s16_8x16b = _mm_add_epi16(s14_8x16b, s15_8x16b);


            /* store 8 8-bit output values  */
            /* Store the output pixels of row 1*/
            _mm_store_si128((__m128i *)(pi2_dst + (dst_strd)), s16_8x16b);


            /* ROW 3*/
            s30_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff0_1_8x16b);
            s31_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff2_3_8x16b);
            s32_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_10_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (7 * src_strd)));

            s4_4_16x8b = _mm_unpacklo_epi8(s2_9_16x8b, s2_10_16x8b);

            s33_8x16b = _mm_maddubs_epi16(s4_4_16x8b, coeff6_7_8x16b);

            s34_8x16b = _mm_add_epi16(s30_8x16b, s31_8x16b);
            s35_8x16b = _mm_add_epi16(s32_8x16b, s33_8x16b);
            s36_8x16b = _mm_add_epi16(s34_8x16b, s35_8x16b);


            /* store 8 8-bit output values  */
            /* Store the output pixels of row 2*/
            _mm_store_si128((__m128i *)(pi2_dst + (3 * dst_strd)), s36_8x16b);

            pu1_src += (8 * src_strd);
            pi2_dst += (4 * dst_strd);

            for(row = 4; row < ht; row += 4)
            {

                PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)

                s3_0_16x8b = s3_2_16x8b;
                s3_1_16x8b = s3_3_16x8b;
                s3_2_16x8b = s3_4_16x8b;

                s0_8x16b = _mm_maddubs_epi16(s3_0_16x8b, coeff0_1_8x16b);
                s1_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff2_3_8x16b);
                s2_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 4)th row*/
                s2_0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));

                s3_3_16x8b = _mm_unpacklo_epi8(s2_10_16x8b, s2_0_16x8b);
                s3_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff6_7_8x16b);

                s4_0_16x8b = s4_2_16x8b;
                s4_1_16x8b = s4_3_16x8b;
                s4_2_16x8b = s4_4_16x8b;

                s4_8x16b = _mm_add_epi16(s0_8x16b, s1_8x16b);
                s5_8x16b = _mm_add_epi16(s2_8x16b, s3_8x16b);
                s6_8x16b = _mm_add_epi16(s4_8x16b, s5_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of row 4*/
                _mm_store_si128((__m128i *)(pi2_dst), s6_8x16b);

                /* row + 2*/
                s20_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff0_1_8x16b);
                s21_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff2_3_8x16b);
                s22_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 5)th row*/
                s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + src_strd));

                /*load 8 pixel values from (cur_row + 6)th row*/
                s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (2 * src_strd)));

                /*unpacking (cur_row + 5)th row and (cur_row + 6)th row*/
                s3_4_16x8b = _mm_unpacklo_epi8(s2_1_16x8b, s2_2_16x8b);

                s23_8x16b = _mm_maddubs_epi16(s3_4_16x8b, coeff6_7_8x16b);

                s24_8x16b = _mm_add_epi16(s20_8x16b, s21_8x16b);
                s25_8x16b = _mm_add_epi16(s22_8x16b, s23_8x16b);
                s26_8x16b = _mm_add_epi16(s24_8x16b, s25_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row+2)*/
                _mm_store_si128((__m128i *)(pi2_dst + (2 * dst_strd)), s26_8x16b);


                /*row + 1*/
                s10_8x16b = _mm_maddubs_epi16(s4_0_16x8b, coeff0_1_8x16b);
                s11_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff2_3_8x16b);
                s12_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff4_5_8x16b);

                /*unpacking (cur_row + 4)th row and (cur_row + 5)th row*/
                s4_3_16x8b = _mm_unpacklo_epi8(s2_0_16x8b, s2_1_16x8b);
                s13_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff6_7_8x16b);

                s14_8x16b = _mm_add_epi16(s10_8x16b, s11_8x16b);
                s15_8x16b = _mm_add_epi16(s12_8x16b, s13_8x16b);
                s16_8x16b = _mm_add_epi16(s14_8x16b, s15_8x16b);


                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row + 1)*/
                _mm_store_si128((__m128i *)(pi2_dst + dst_strd), s16_8x16b);


                /* row + 3*/
                s30_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff0_1_8x16b);
                s31_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff2_3_8x16b);
                s32_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 7)th row*/
                s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (3 * src_strd)));

                /*unpacking (cur_row + 6)th row and (cur_row + 7)th row*/
                s4_4_16x8b = _mm_unpacklo_epi8(s2_2_16x8b, s2_3_16x8b);

                s33_8x16b = _mm_maddubs_epi16(s4_4_16x8b, coeff6_7_8x16b);

                s34_8x16b = _mm_add_epi16(s30_8x16b, s31_8x16b);
                s35_8x16b = _mm_add_epi16(s32_8x16b, s33_8x16b);
                s36_8x16b = _mm_add_epi16(s34_8x16b, s35_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row+3)*/
                _mm_store_si128((__m128i *)(pi2_dst + (3 * dst_strd)), s36_8x16b);

                s2_10_16x8b = s2_3_16x8b;


                pu1_src += 4 * src_strd; /* pointer update */
                pi2_dst += 4 * dst_strd; /* pointer update */
            }
        }
    }
    else /* wd = multiple of 8 case */
    {

        pu1_src_copy = pu1_src;
        pi2_dst_copy = pi2_dst;

        for(col = 0; col < wd; col += 4)
        {

            pu1_src = pu1_src_copy + col;
            pi2_dst = pi2_dst_copy + col;

            PREFETCH((char const *)(pu1_src + (8 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (9 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (10 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (11 * src_strd)), _MM_HINT_T0)

            /*load 8 pixel values */
            s2_0_16x8b  = _mm_loadl_epi64((__m128i *)(pu1_src + (-3 * src_strd)));

            /*load 8 pixel values */
            s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (-2 * src_strd)));

            s3_0_16x8b = _mm_unpacklo_epi8(s2_0_16x8b, s2_1_16x8b);

            s0_8x16b = _mm_maddubs_epi16(s3_0_16x8b, coeff0_1_8x16b);

            /*load 8 pixel values */
            s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (-1 * src_strd)));

            /*load 8 pixel values */
            s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (0 * src_strd)));

            s3_1_16x8b = _mm_unpacklo_epi8(s2_2_16x8b, s2_3_16x8b);

            s1_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff2_3_8x16b);

            /*load 8 pixel values */
            s2_4_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (1 * src_strd)));

            /*load 8 pixel values */
            s2_5_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (2 * src_strd)));

            s3_2_16x8b = _mm_unpacklo_epi8(s2_4_16x8b, s2_5_16x8b);

            s2_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_6_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (3 * src_strd)));

            /*load 8 pixel values */
            s2_7_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (4 * src_strd)));

            s3_3_16x8b = _mm_unpacklo_epi8(s2_6_16x8b, s2_7_16x8b);

            s3_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff6_7_8x16b);

            s4_8x16b = _mm_add_epi16(s0_8x16b, s1_8x16b);
            s5_8x16b = _mm_add_epi16(s2_8x16b, s3_8x16b);
            s6_8x16b = _mm_add_epi16(s4_8x16b, s5_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 0*/
            _mm_storel_epi64((__m128i *)(pi2_dst), s6_8x16b);

            /* ROW 2*/
            s20_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff0_1_8x16b);
            s21_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff2_3_8x16b);
            s22_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_8_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (5 * src_strd)));

            /*load 8 pixel values */
            s2_9_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (6 * src_strd)));

            s3_4_16x8b = _mm_unpacklo_epi8(s2_8_16x8b, s2_9_16x8b);

            s23_8x16b = _mm_maddubs_epi16(s3_4_16x8b, coeff6_7_8x16b);

            s24_8x16b = _mm_add_epi16(s20_8x16b, s21_8x16b);
            s25_8x16b = _mm_add_epi16(s22_8x16b, s23_8x16b);
            s26_8x16b = _mm_add_epi16(s24_8x16b, s25_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 2*/
            _mm_storel_epi64((__m128i *)(pi2_dst + (2 * dst_strd)), s26_8x16b);


            /*ROW 1*/
            s4_0_16x8b = _mm_unpacklo_epi8(s2_1_16x8b, s2_2_16x8b);

            s10_8x16b = _mm_maddubs_epi16(s4_0_16x8b, coeff0_1_8x16b);

            s4_1_16x8b = _mm_unpacklo_epi8(s2_3_16x8b, s2_4_16x8b);

            s11_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff2_3_8x16b);

            s4_2_16x8b = _mm_unpacklo_epi8(s2_5_16x8b, s2_6_16x8b);

            s12_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff4_5_8x16b);

            s4_3_16x8b = _mm_unpacklo_epi8(s2_7_16x8b, s2_8_16x8b);

            s13_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff6_7_8x16b);

            s14_8x16b = _mm_add_epi16(s10_8x16b, s11_8x16b);
            s15_8x16b = _mm_add_epi16(s12_8x16b, s13_8x16b);
            s16_8x16b = _mm_add_epi16(s14_8x16b, s15_8x16b);


            /* store 8 8-bit output values  */
            /* Store the output pixels of row 1*/
            _mm_storel_epi64((__m128i *)(pi2_dst + (dst_strd)), s16_8x16b);


            /* ROW 3*/
            s30_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff0_1_8x16b);
            s31_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff2_3_8x16b);
            s32_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_10_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (7 * src_strd)));

            s4_4_16x8b = _mm_unpacklo_epi8(s2_9_16x8b, s2_10_16x8b);

            s33_8x16b = _mm_maddubs_epi16(s4_4_16x8b, coeff6_7_8x16b);

            s34_8x16b = _mm_add_epi16(s30_8x16b, s31_8x16b);
            s35_8x16b = _mm_add_epi16(s32_8x16b, s33_8x16b);
            s36_8x16b = _mm_add_epi16(s34_8x16b, s35_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 2*/
            _mm_storel_epi64((__m128i *)(pi2_dst + (3 * dst_strd)), s36_8x16b);

            pu1_src += (8 * src_strd);
            pi2_dst += (4 * dst_strd);

            for(row = 4; row < ht; row += 4)
            {

                PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)

                s3_0_16x8b = s3_2_16x8b;
                s3_1_16x8b = s3_3_16x8b;
                s3_2_16x8b = s3_4_16x8b;

                s0_8x16b = _mm_maddubs_epi16(s3_0_16x8b, coeff0_1_8x16b);
                s1_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff2_3_8x16b);
                s2_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 4)th row*/
                s2_0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));

                s3_3_16x8b = _mm_unpacklo_epi8(s2_10_16x8b, s2_0_16x8b);
                s3_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff6_7_8x16b);

                s4_0_16x8b = s4_2_16x8b;
                s4_1_16x8b = s4_3_16x8b;
                s4_2_16x8b = s4_4_16x8b;

                s4_8x16b = _mm_add_epi16(s0_8x16b, s1_8x16b);
                s5_8x16b = _mm_add_epi16(s2_8x16b, s3_8x16b);
                s6_8x16b = _mm_add_epi16(s4_8x16b, s5_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of row 4*/
                _mm_storel_epi64((__m128i *)(pi2_dst), s6_8x16b);

                /* row + 2*/
                s20_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff0_1_8x16b);
                s21_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff2_3_8x16b);
                s22_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 5)th row*/
                s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + src_strd));

                /*load 8 pixel values from (cur_row + 6)th row*/
                s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (2 * src_strd)));

                /*unpacking (cur_row + 5)th row and (cur_row + 6)th row*/
                s3_4_16x8b = _mm_unpacklo_epi8(s2_1_16x8b, s2_2_16x8b);

                s23_8x16b = _mm_maddubs_epi16(s3_4_16x8b, coeff6_7_8x16b);

                s24_8x16b = _mm_add_epi16(s20_8x16b, s21_8x16b);
                s25_8x16b = _mm_add_epi16(s22_8x16b, s23_8x16b);
                s26_8x16b = _mm_add_epi16(s24_8x16b, s25_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row+2)*/
                _mm_storel_epi64((__m128i *)(pi2_dst + (2 * dst_strd)), s26_8x16b);


                /*row + 1*/
                s10_8x16b = _mm_maddubs_epi16(s4_0_16x8b, coeff0_1_8x16b);
                s11_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff2_3_8x16b);
                s12_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff4_5_8x16b);

                /*unpacking (cur_row + 4)th row and (cur_row + 5)th row*/
                s4_3_16x8b = _mm_unpacklo_epi8(s2_0_16x8b, s2_1_16x8b);
                s13_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff6_7_8x16b);

                s14_8x16b = _mm_add_epi16(s10_8x16b, s11_8x16b);
                s15_8x16b = _mm_add_epi16(s12_8x16b, s13_8x16b);
                s16_8x16b = _mm_add_epi16(s14_8x16b, s15_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row + 1)*/
                _mm_storel_epi64((__m128i *)(pi2_dst + dst_strd), s16_8x16b);


                /* row + 3*/
                s30_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff0_1_8x16b);
                s31_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff2_3_8x16b);
                s32_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 7)th row*/
                s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (3 * src_strd)));

                /*unpacking (cur_row + 6)th row and (cur_row + 7)th row*/
                s4_4_16x8b = _mm_unpacklo_epi8(s2_2_16x8b, s2_3_16x8b);

                s33_8x16b = _mm_maddubs_epi16(s4_4_16x8b, coeff6_7_8x16b);

                s34_8x16b = _mm_add_epi16(s30_8x16b, s31_8x16b);
                s35_8x16b = _mm_add_epi16(s32_8x16b, s33_8x16b);
                s36_8x16b = _mm_add_epi16(s34_8x16b, s35_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row+3)*/
                _mm_storel_epi64((__m128i *)(pi2_dst + (3 * dst_strd)), s36_8x16b);

                s2_10_16x8b = s2_3_16x8b;

                pu1_src += 4 * src_strd; /* pointer update */
                pi2_dst += 4 * dst_strd; /* pointer update */
            }
        }
    }
}